

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-extract.c
# Opt level: O2

void test_regex(void)

{
  char cVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  char *pcVar5;
  char *flags;
  char *regex;
  
  uVar3 = bson_bcon_magic();
  uVar3 = bcon_new(0,"foo",uVar3,10,"^foo|bar$","i",0);
  uVar4 = bson_bcone_magic();
  cVar1 = bcon_extract(uVar3,"foo",uVar4,10,&regex,&flags,0);
  if (cVar1 == '\0') {
    pcVar5 = "BCON_EXTRACT (bcon, \"foo\", BCONE_REGEX (regex, flags))";
    uVar3 = 0x95;
  }
  else {
    iVar2 = strcmp(regex,"^foo|bar$");
    if (iVar2 == 0) {
      if ((*flags == 'i') && (flags[1] == '\0')) {
        bson_destroy(uVar3);
        return;
      }
      pcVar5 = "strcmp (flags, \"i\") == 0";
      uVar3 = 0x98;
    }
    else {
      pcVar5 = "strcmp (regex, \"^foo|bar$\") == 0";
      uVar3 = 0x97;
    }
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
          ,uVar3,"test_regex",pcVar5);
  abort();
}

Assistant:

static void
test_regex (void)
{
   const char *regex;
   const char *flags;

   bson_t *bcon = BCON_NEW ("foo", BCON_REGEX ("^foo|bar$", "i"));

   BSON_ASSERT (BCON_EXTRACT (bcon, "foo", BCONE_REGEX (regex, flags)));

   BSON_ASSERT (strcmp (regex, "^foo|bar$") == 0);
   BSON_ASSERT (strcmp (flags, "i") == 0);

   bson_destroy (bcon);
}